

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O1

stumpless_filter_func_t stumpless_get_target_filter(stumpless_target *target)

{
  stumpless_filter_func_t p_Var1;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    p_Var1 = (stumpless_filter_func_t)0x0;
  }
  else {
    pthread_lock_mutex((pthread_mutex_t *)target->mutex);
    p_Var1 = target->filter;
    pthread_unlock_mutex((pthread_mutex_t *)target->mutex);
    clear_error();
  }
  return p_Var1;
}

Assistant:

stumpless_filter_func_t
stumpless_get_target_filter( const struct stumpless_target *target ) {
  stumpless_filter_func_t filter;

  VALIDATE_ARG_NOT_NULL( target );

  lock_target( target );
  filter = target->filter;
  unlock_target( target );

  clear_error(  );
  return filter;
}